

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_mapreduce(CuTest *tc)

{
  selist *local_20;
  selist *ql;
  int result;
  int buffer;
  CuTest *tc_local;
  
  ql._0_4_ = 0;
  local_20 = (selist *)0x0;
  _result = tc;
  selist_push(&local_20,lipsum);
  selist_push(&local_20,lipsum);
  selist_map_reduce(local_20,my_map,my_reduce,(void *)((long)&ql + 4),&ql);
  CuAssertIntEquals_LineMsg
            (_result,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x1d,(char *)0x0,0x98,(int)ql);
  selist_free(local_20);
  return;
}

Assistant:

static void test_mapreduce(CuTest * tc)
{
    int buffer;
    int result = 0;
    struct selist *ql = NULL;
    selist_push(&ql, (void *)lipsum);
    selist_push(&ql, (void *)lipsum);
    selist_map_reduce(ql, my_map, my_reduce, &buffer, &result);
    CuAssertIntEquals(tc, 152, result);
    selist_free(ql);
}